

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O2

void __thiscall
TEST_MockStrictOrderTest_orderViolated_TestShell::TEST_MockStrictOrderTest_orderViolated_TestShell
          (TEST_MockStrictOrderTest_orderViolated_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_002ed0b0;
  return;
}

Assistant:

TEST(MockStrictOrderTest, orderViolated)
{
    MockFailureReporterInstaller failureReporterInstaller;
    mock().strictOrder();

    MockExpectedCallsListForTest expectations;
    expectations.addFunctionOrdered("foo1", 1)->callWasMade(1);
    expectations.addFunctionOrdered("foo1", 2)->callWasMade(3);
    expectations.addFunctionOrdered("foo2", 3)->callWasMade(2);
    MockCallOrderFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("foo1");
    mock().expectOneCall("foo1");
    mock().expectOneCall("foo2");
    mock().actualCall("foo1");
    mock().actualCall("foo2");
    mock().actualCall("foo1");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}